

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssertionExpr.cpp
# Opt level: O0

AssertionExpr *
slang::ast::BinaryAssertionExpr::fromSyntax(BinarySequenceExprSyntax *syntax,ASTContext *context)

{
  SourceRange sourceRange;
  bool bVar1;
  int iVar2;
  SequenceExprSyntax *pSVar3;
  undefined4 extraout_var;
  BinaryAssertionExpr *pBVar4;
  ASTContext *in_RSI;
  int *in_RDI;
  SourceRange SVar5;
  anon_class_8_1_898e4d05 check;
  BinaryAssertionOperator op;
  AssertionExpr *right;
  AssertionExpr *left;
  Compilation *comp;
  ASTContext *in_stack_ffffffffffffff58;
  Diagnostic *in_stack_ffffffffffffff60;
  SourceLocation in_stack_ffffffffffffff68;
  SourceLocation in_stack_ffffffffffffff70;
  ASTContext *in_stack_ffffffffffffff78;
  Diagnostic *in_stack_ffffffffffffff80;
  socklen_t __len;
  DiagCode code;
  undefined1 in_stack_ffffffffffffff90 [16];
  SyntaxNode *in_stack_ffffffffffffffb0;
  int local_2c;
  SourceRange *args_3;
  
  code = in_stack_ffffffffffffff90._4_4_;
  ASTContext::getCompilation((ASTContext *)0xb405b4);
  pSVar3 = not_null<slang::syntax::SequenceExprSyntax_*>::operator*
                     ((not_null<slang::syntax::SequenceExprSyntax_*> *)0xb405cd);
  __len = 0;
  iVar2 = AssertionExpr::bind((int)pSVar3,(sockaddr *)in_RSI,0);
  args_3 = (SourceRange *)CONCAT44(extraout_var,iVar2);
  pSVar3 = not_null<slang::syntax::SequenceExprSyntax_*>::operator*
                     ((not_null<slang::syntax::SequenceExprSyntax_*> *)0xb405fc);
  AssertionExpr::bind((int)pSVar3,(sockaddr *)in_RSI,__len);
  iVar2 = *in_RDI;
  if (iVar2 == 0xe) {
    local_2c = 0;
  }
  else if (iVar2 == 0x107) {
    local_2c = 2;
  }
  else if (iVar2 == 0x152) {
    local_2c = 1;
  }
  else if (iVar2 == 0x1cd) {
    local_2c = 3;
  }
  else {
    local_2c = 4;
  }
  if (local_2c == 3) {
    bVar1 = fromSyntax::anon_class_8_1_898e4d05::operator()
                      ((anon_class_8_1_898e4d05 *)in_stack_ffffffffffffff68);
    if (!bVar1) {
      not_null<slang::syntax::SequenceExprSyntax_*>::operator->
                ((not_null<slang::syntax::SequenceExprSyntax_*> *)0xb406da);
      slang::syntax::SyntaxNode::sourceRange(in_stack_ffffffffffffffb0);
      sourceRange.endLoc._0_4_ = __len;
      sourceRange.startLoc = (SourceLocation)in_stack_ffffffffffffff80;
      sourceRange.endLoc._4_4_ = iVar2;
      in_stack_ffffffffffffff80 = ASTContext::addDiag(in_RSI,code,sourceRange);
      parsing::Token::range((Token *)in_stack_ffffffffffffff80);
      SVar5.endLoc = in_stack_ffffffffffffff70;
      SVar5.startLoc = in_stack_ffffffffffffff68;
      Diagnostic::operator<<(in_stack_ffffffffffffff60,SVar5);
      in_stack_ffffffffffffff78 = in_RSI;
    }
    AssertionExpr::requireSequence
              ((AssertionExpr *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  }
  else if ((local_2c != 0) && (local_2c != 1)) {
    AssertionExpr::requireSequence
              ((AssertionExpr *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    AssertionExpr::requireSequence
              ((AssertionExpr *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  }
  SVar5 = parsing::Token::range((Token *)in_stack_ffffffffffffff80);
  pBVar4 = BumpAllocator::
           emplace<slang::ast::BinaryAssertionExpr,slang::ast::BinaryAssertionOperator&,slang::ast::AssertionExpr_const&,slang::ast::AssertionExpr_const&,slang::SourceRange>
                     ((BumpAllocator *)SVar5.startLoc,
                      (BinaryAssertionOperator *)CONCAT44(iVar2,__len),
                      (AssertionExpr *)in_stack_ffffffffffffff80,
                      (AssertionExpr *)in_stack_ffffffffffffff78,args_3);
  return &pBVar4->super_AssertionExpr;
}

Assistant:

AssertionExpr& BinaryAssertionExpr::fromSyntax(const BinarySequenceExprSyntax& syntax,
                                               const ASTContext& context) {
    auto& comp = context.getCompilation();
    auto& left = bind(*syntax.left, context);
    auto& right = bind(*syntax.right, context);

    // clang-format off
    BinaryAssertionOperator op;
    switch (syntax.kind) {
        case SyntaxKind::AndSequenceExpr: op = BinaryAssertionOperator::And; break;
        case SyntaxKind::OrSequenceExpr: op = BinaryAssertionOperator::Or; break;
        case SyntaxKind::IntersectSequenceExpr: op = BinaryAssertionOperator::Intersect; break;
        case SyntaxKind::ThroughoutSequenceExpr: op = BinaryAssertionOperator::Throughout; break;
        case SyntaxKind::WithinSequenceExpr: op = BinaryAssertionOperator::Within; break;
        default: SLANG_UNREACHABLE;
    }
    // clang-format on

    if (op == BinaryAssertionOperator::Throughout) {
        auto check = [&] {
            if (left.kind != AssertionExprKind::Simple)
                return false;

            auto& simple = left.as<SimpleAssertionExpr>();
            if (simple.repetition)
                return false;

            return simple.expr.kind != ExpressionKind::AssertionInstance;
        };

        if (!check()) {
            context.addDiag(diag::ThroughoutLhsInvalid, syntax.left->sourceRange())
                << syntax.op.range();
        }
        right.requireSequence(context);
    }
    else if (op != BinaryAssertionOperator::And && op != BinaryAssertionOperator::Or) {
        // The 'and' and 'or' operators may just be simple property references,
        // which is fine unless someone up above us decides they need sequences only.
        left.requireSequence(context);
        right.requireSequence(context);
    }

    return *comp.emplace<BinaryAssertionExpr>(op, left, right, syntax.op.range());
}